

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O3

adios2_error adios2_enter_computation_block(adios2_adios *adios)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"for adios2_adios, in call to adios2_enter_computation_block","");
  adios2::helper::CheckForNullptr<adios2_adios>(adios,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  adios2::core::ADIOS::EnterComputationBlock();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_enter_computation_block(adios2_adios *adios)
{
    try
    {
        adios2::helper::CheckForNullptr(
            adios, "for adios2_adios, in call to adios2_enter_computation_block");
        reinterpret_cast<adios2::core::ADIOS *>(adios)->EnterComputationBlock();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_enter_computation_block"));
    }
}